

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector3 Vector3Barycenter(Vector3 p,Vector3 a,Vector3 b,Vector3 c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vector3 VVar13;
  
  fVar3 = a.z;
  fVar1 = a.x;
  fVar5 = b.x - fVar1;
  fVar2 = a.y;
  fVar6 = b.y - fVar2;
  fVar7 = b.z - fVar3;
  fVar9 = c.x - fVar1;
  fVar10 = c.y - fVar2;
  fVar11 = c.z - fVar3;
  fVar1 = p.x - fVar1;
  fVar2 = p.y - fVar2;
  fVar3 = p.z - fVar3;
  fVar4 = fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6;
  fVar8 = fVar7 * fVar11 + fVar5 * fVar9 + fVar6 * fVar10;
  fVar12 = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
  fVar5 = fVar1 * fVar5 + fVar2 * fVar6 + fVar3 * fVar7;
  fVar2 = fVar3 * fVar11 + fVar2 * fVar10 + fVar1 * fVar9;
  fVar1 = fVar4 * fVar12 - fVar8 * fVar8;
  fVar3 = (fVar12 * fVar5 - fVar2 * fVar8) / fVar1;
  fVar1 = (fVar4 * fVar2 - fVar5 * fVar8) / fVar1;
  VVar13.x = 1.0 - (fVar1 + fVar3);
  VVar13.y = fVar3;
  VVar13.z = fVar1;
  return VVar13;
}

Assistant:

RMDEF Vector3 Vector3Barycenter(Vector3 p, Vector3 a, Vector3 b, Vector3 c)
{
    //Vector v0 = b - a, v1 = c - a, v2 = p - a;

    Vector3 v0 = Vector3Subtract(b, a);
    Vector3 v1 = Vector3Subtract(c, a);
    Vector3 v2 = Vector3Subtract(p, a);
    float d00 = Vector3DotProduct(v0, v0);
    float d01 = Vector3DotProduct(v0, v1);
    float d11 = Vector3DotProduct(v1, v1);
    float d20 = Vector3DotProduct(v2, v0);
    float d21 = Vector3DotProduct(v2, v1);

    float denom = d00*d11 - d01*d01;

    Vector3 result = { 0 };

    result.y = (d11*d20 - d01*d21)/denom;
    result.z = (d00*d21 - d01*d20)/denom;
    result.x = 1.0f - (result.z + result.y);

    return result;
}